

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall t_js_generator::generate_const(t_js_generator *this,t_const *tconst)

{
  t_type *type;
  t_const_value *value;
  ostream *poVar1;
  string name;
  string sStack_c8;
  string local_a8 [32];
  string local_88;
  string local_68;
  string local_48;
  
  type = tconst->type_;
  std::__cxx11::string::string(local_a8,(string *)&tconst->name_);
  value = tconst->value_;
  js_type_namespace_abi_cxx11_
            (&sStack_c8,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&sStack_c8);
  poVar1 = std::operator<<(poVar1,local_a8);
  std::operator<<(poVar1," = ");
  std::__cxx11::string::~string((string *)&sStack_c8);
  render_const_value_abi_cxx11_(&sStack_c8,this,type,value);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&sStack_c8);
  poVar1 = std::operator<<(poVar1,";");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_c8);
  if (this->gen_ts_ == true) {
    ts_print_doc_abi_cxx11_(&sStack_c8,this,&tconst->super_t_doc);
    poVar1 = std::operator<<((ostream *)&this->f_types_ts_,(string *)&sStack_c8);
    ts_indent_abi_cxx11_(&local_48,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    ts_declare_abi_cxx11_(&local_68,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,(string *)&this->js_const_type_);
    poVar1 = std::operator<<(poVar1,local_a8);
    poVar1 = std::operator<<(poVar1,": ");
    ts_get_type_abi_cxx11_(&local_88,this,type);
    poVar1 = std::operator<<(poVar1,(string *)&local_88);
    poVar1 = std::operator<<(poVar1,";");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_c8);
  }
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

void t_js_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  f_types_ << js_type_namespace(program_) << name << " = ";
  f_types_ << render_const_value(type, value) << ";" << endl;

  if (gen_ts_) {
    f_types_ts_ << ts_print_doc(tconst) << ts_indent() << ts_declare() << js_const_type_ << name << ": "
                << ts_get_type(type) << ";" << endl;
  }
}